

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O0

void __thiscall features::Sift::descriptor_generation(Sift *this)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  Keypoint *pKVar5;
  runtime_error *prVar6;
  reference pvVar7;
  __type _Var8;
  undefined1 local_268 [4];
  float scale_factor;
  Descriptor desc;
  size_t j;
  vector<float,_std::allocator<float>_> orientations;
  Keypoint *kp;
  size_t i;
  Octave *octave;
  int octave_index;
  Sift *this_local;
  
  bVar2 = std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::empty
                    (&this->octaves);
  if (bVar2) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Octaves not available!");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::empty
                    (&this->keypoints);
  if (!bVar2) {
    std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::clear
              (&this->descriptors);
    sVar3 = std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::size
                      (&this->keypoints);
    std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::reserve
              (&this->descriptors,sVar3 * 3 >> 1);
    pvVar4 = std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::
             operator[](&this->keypoints,0);
    octave._0_4_ = (float)pvVar4->octave;
    i = (size_t)std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::
                operator[](&this->octaves,(long)((int)octave._0_4_ - (this->options).min_octave));
    generate_grad_ori_images(this,(Octave *)i);
    for (kp = (Keypoint *)0x0;
        pKVar5 = (Keypoint *)
                 std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::
                 size(&this->keypoints), kp < pKVar5; kp = (Keypoint *)((long)&kp->octave + 1)) {
      orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           (pointer)std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
                    ::operator[](&this->keypoints,(size_type)kp);
      if ((int)octave._0_4_ <
          ((reference)
          orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)->octave) {
        if (i != 0) {
          std::
          vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
          ::clear((vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                   *)(i + 0x30));
          std::
          vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
          ::clear((vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                   *)(i + 0x48));
        }
        octave._0_4_ = *orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
        i = (size_t)std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::
                    operator[](&this->octaves,(long)((int)octave._0_4_ - (this->options).min_octave)
                              );
        generate_grad_ori_images(this,(Octave *)i);
      }
      else if (((reference)
               orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage)->octave < (int)octave._0_4_) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"Decreasing octave index!");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&j);
      std::vector<float,_std::allocator<float>_>::reserve
                ((vector<float,_std::allocator<float>_> *)&j,8);
      orientation_assignment
                (this,(Keypoint *)
                      orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(Octave *)i,
                 (vector<float,_std::allocator<float>_> *)&j);
      desc.data.v[0x7e] = 0.0;
      desc.data.v[0x7f] = 0.0;
      for (; uVar1 = desc.data.v._504_8_,
          sVar3 = std::vector<float,_std::allocator<float>_>::size
                            ((vector<float,_std::allocator<float>_> *)&j), (ulong)uVar1 < sVar3;
          desc.data.v._504_8_ = desc.data.v._504_8_ + 1) {
        Descriptor::Descriptor((Descriptor *)local_268);
        _Var8 = std::pow<float,int>(2.0,(int)*orientations.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_268 = (undefined1  [4])
                    ((float)_Var8 *
                     (orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[2] + 0.5) + -0.5);
        scale_factor = (float)_Var8 *
                       (orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage[3] + 0.5) + -0.5;
        desc.x = keypoint_absolute_scale
                           (this,(Keypoint *)
                                 orientations.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&j,desc.data.v._504_8_);
        desc.y = *pvVar7;
        bVar2 = descriptor_assignment
                          (this,(Keypoint *)
                                orientations.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (Descriptor *)local_268,(Octave *)i);
        if (bVar2) {
          std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::
          push_back(&this->descriptors,(value_type *)local_268);
        }
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)&j);
    }
  }
  return;
}

Assistant:

void
Sift::descriptor_generation (void)
{
    if (this->octaves.empty())
        throw std::runtime_error("Octaves not available!");
    if (this->keypoints.empty())
        return;

    this->descriptors.clear();
    this->descriptors.reserve(this->keypoints.size() * 3 / 2);

    /*
     * Keep a buffer of S+3 gradient and orientation images for the current
     * octave. Once the octave is changed, these images are recomputed.
     * To ensure efficiency, the octave index must always increase, never
     * decrease, which is enforced during the algorithm.
     */
    int octave_index = this->keypoints[0].octave;
    Octave* octave = &this->octaves[octave_index - this->options.min_octave];
    this->generate_grad_ori_images(octave);

    /* Walk over all keypoints and compute descriptors. */
    for (std::size_t i = 0; i < this->keypoints.size(); ++i)
    {
        Keypoint const& kp(this->keypoints[i]);

        /* Generate new gradient and orientation images if octave changed. */
        if (kp.octave > octave_index)
        {
            /* Clear old octave gradient and orientation images. */
            if (octave)
            {
                octave->grad.clear();
                octave->ori.clear();
            }
            /* Setup new octave gradient and orientation images. */
            octave_index = kp.octave;
            octave = &this->octaves[octave_index - this->options.min_octave];
            this->generate_grad_ori_images(octave);
        }
        else if (kp.octave < octave_index)
        {
            throw std::runtime_error("Decreasing octave index!");
        }

        /* Orientation assignment. This returns multiple orientations. */
        std::vector<float> orientations;
        orientations.reserve(8);
        this->orientation_assignment(kp, octave, orientations);

        /* Feature vector extraction. */
        for (std::size_t j = 0; j < orientations.size(); ++j)
        {
            Descriptor desc;
            float const scale_factor = std::pow(2.0f, kp.octave);
            desc.x = scale_factor * (kp.x + 0.5f) - 0.5f;
            desc.y = scale_factor * (kp.y + 0.5f) - 0.5f;
            desc.scale = this->keypoint_absolute_scale(kp);
            desc.orientation = orientations[j];
            if (this->descriptor_assignment(kp, desc, octave))
                this->descriptors.push_back(desc);
        }
    }
}